

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::prim::print_prim_abi_cxx11_
          (string *__return_storage_ptr__,prim *this,Prim *prim,uint32_t indent)

{
  reference s_00;
  reference s_01;
  bool bVar1;
  bool bVar2;
  value *this_00;
  ulong uVar3;
  char *pcVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *pmVar5;
  size_type sVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
  *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *props;
  value_type *pvVar7;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *pvVar8;
  size_type sVar9;
  PrimMeta *pPVar10;
  size_type sVar11;
  const_reference pvVar12;
  string *psVar13;
  const_reference pvVar14;
  pointer ppVar15;
  ostream *poVar16;
  uint32_t uVar17;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  undefined1 in_R8B;
  string local_548;
  string local_528;
  ulong local_508;
  size_t i_5;
  _Self local_4e0;
  _Self local_4d8;
  iterator it_1;
  token nameTok_1;
  size_t i_4;
  const_reference local_498;
  ulong local_490;
  size_t i_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable_1;
  string local_438;
  string local_418;
  ulong local_3f8;
  size_t i_2;
  _Self local_3d0;
  _Self local_3c8;
  iterator it;
  token nameTok;
  size_t i_1;
  const_reference local_388;
  ulong local_380;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  string local_328;
  string local_308;
  Variant *local_2e8;
  Variant *variant;
  string local_2d8;
  string local_2b8;
  string local_298;
  reference local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>
  *variantItem;
  const_iterator __end4;
  const_iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
  *__range4;
  string local_250;
  string local_230;
  string local_210;
  reference local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>
  *variantSet;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *__range3;
  undefined1 local_1c8 [7];
  bool require_newline;
  string s;
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  Prim *pPStack_18;
  uint32_t indent_local;
  Prim *prim_local;
  
  local_1c = (uint)prim;
  pPStack_18 = (Prim *)this;
  prim_local = (Prim *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(s.field_2._M_local_buf + 8));
  this_00 = (value *)Prim::data(pPStack_18);
  sVar9 = 0;
  tinyusdz::value::pprint_value_abi_cxx11_
            ((string *)local_1c8,this_00,(Value *)(ulong)local_1c,0,(bool)in_R8B);
  bVar2 = true;
  uVar3 = ::std::__cxx11::string::size();
  if (2 < uVar3) {
    ::std::__cxx11::string::size();
    pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)local_1c8);
    if (*pcVar4 == '{') {
      ::std::__cxx11::string::size();
      pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)local_1c8);
      if (*pcVar4 == '\n') {
        bVar2 = false;
      }
    }
  }
  ::std::operator<<(aoStack_198,(string *)local_1c8);
  pmVar5 = Prim::variantSets_abi_cxx11_(pPStack_18);
  sVar6 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
          ::size(pmVar5);
  if (sVar6 != 0) {
    if (bVar2) {
      ::std::operator<<(aoStack_198,"\n");
    }
    bVar2 = true;
    pmVar5 = Prim::variantSets_abi_cxx11_(pPStack_18);
    __end3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
             ::begin(pmVar5);
    variantSet = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>
                  *)::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                    ::end(pmVar5);
    while (bVar1 = ::std::operator!=(&__end3,(_Self *)&variantSet), bVar1) {
      local_1f0 = ::std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>
                  ::operator*(&__end3);
      pprint::Indent_abi_cxx11_(&local_210,(pprint *)(ulong)(local_1c + 1),n);
      poVar16 = ::std::operator<<(aoStack_198,(string *)&local_210);
      poVar16 = ::std::operator<<(poVar16,"variantSet ");
      s_01 = local_1f0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_250,"\"",(allocator *)((long)&__range4 + 7));
      quote(&local_230,&s_01->first,&local_250);
      poVar16 = ::std::operator<<(poVar16,(string *)&local_230);
      ::std::operator<<(poVar16," = {\n");
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::__cxx11::string::~string((string *)&local_250);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      ::std::__cxx11::string::~string((string *)&local_210);
      this_01 = &(local_1f0->second).variantSet;
      __end4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
               ::begin(this_01);
      variantItem = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>
                     *)::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                       ::end(this_01);
      while( true ) {
        bVar1 = ::std::operator!=(&__end4,(_Self *)&variantItem);
        uVar17 = (uint32_t)sVar9;
        if (!bVar1) break;
        local_278 = ::std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>
                    ::operator*(&__end4);
        pprint::Indent_abi_cxx11_(&local_298,(pprint *)(ulong)(local_1c + 2),n_01);
        poVar16 = ::std::operator<<(aoStack_198,(string *)&local_298);
        s_00 = local_278;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2d8,"\"",(allocator *)((long)&variant + 7));
        quote(&local_2b8,&s_00->first,&local_2d8);
        ::std::operator<<(poVar16,(string *)&local_2b8);
        ::std::__cxx11::string::~string((string *)&local_2b8);
        ::std::__cxx11::string::~string((string *)&local_2d8);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&variant + 7));
        ::std::__cxx11::string::~string((string *)&local_298);
        local_2e8 = &local_278->second;
        pPVar10 = Variant::metas(local_2e8);
        bVar1 = PrimMetas::authored(pPVar10);
        if (bVar1) {
          ::std::operator<<(aoStack_198," (\n");
          pPVar10 = Variant::metas(local_2e8);
          print_prim_metas_abi_cxx11_
                    (&local_308,(tinyusdz *)pPVar10,(PrimMeta *)(ulong)(local_1c + 3),uVar17);
          ::std::operator<<(aoStack_198,(string *)&local_308);
          ::std::__cxx11::string::~string((string *)&local_308);
          pprint::Indent_abi_cxx11_(&local_328,(pprint *)(ulong)(local_1c + 2),n_02);
          poVar16 = ::std::operator<<(aoStack_198,(string *)&local_328);
          ::std::operator<<(poVar16,")");
          ::std::__cxx11::string::~string((string *)&local_328);
        }
        ::std::operator<<(aoStack_198," {\n");
        props = Variant::properties_abi_cxx11_(local_2e8);
        print_props((string *)&primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count,props,
                    local_1c + 3);
        ::std::operator<<(aoStack_198,
                          (string *)&primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        ::std::__cxx11::string::~string
                  ((string *)&primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pPVar10 = Variant::metas(local_2e8);
        bVar1 = nonstd::optional_lite::
                optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::has_value
                          (&pPVar10->variantChildren);
        if (bVar1) {
          pPVar10 = Variant::metas(local_2e8);
          pvVar7 = nonstd::optional_lite::
                   optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::value
                             (&pPVar10->variantChildren);
          sVar9 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size(pvVar7);
          pvVar8 = Variant::primChildren(local_2e8);
          sVar11 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                             ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
          if (sVar9 != sVar11) goto LAB_004313c3;
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 *)&i);
          local_380 = 0;
          while( true ) {
            uVar3 = local_380;
            pvVar8 = Variant::primChildren(local_2e8);
            sVar9 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
            if (sVar9 <= uVar3) break;
            pvVar8 = Variant::primChildren(local_2e8);
            pvVar12 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                                (pvVar8,local_380);
            psVar13 = Prim::element_name_abi_cxx11_(pvVar12);
            pvVar8 = Variant::primChildren(local_2e8);
            local_388 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                                  (pvVar8,local_380);
            ::std::
            map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
            ::emplace<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                      ((map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                        *)&i,psVar13,&local_388);
            local_380 = local_380 + 1;
          }
          nameTok.str_.field_2._8_8_ = 0;
          while( true ) {
            pPVar10 = Variant::metas(local_2e8);
            pvVar7 = nonstd::optional_lite::
                     optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
                     value(&pPVar10->variantChildren);
            sVar9 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size(pvVar7);
            if (sVar9 <= (ulong)nameTok.str_.field_2._8_8_) break;
            pPVar10 = Variant::metas(local_2e8);
            uVar17 = (uint32_t)sVar9;
            pvVar7 = nonstd::optional_lite::
                     optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
                     value(&pPVar10->variantChildren);
            pvVar14 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                                (pvVar7,nameTok.str_.field_2._8_8_);
            Token::Token((Token *)&it,pvVar14);
            psVar13 = Token::str_abi_cxx11_((Token *)&it);
            local_3c8._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                         *)&i,psVar13);
            local_3d0._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        *)&i);
            bVar1 = ::std::operator!=(&local_3c8,&local_3d0);
            if (bVar1) {
              ppVar15 = ::std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>
                        ::operator->(&local_3c8);
              print_prim_abi_cxx11_
                        ((string *)&i_2,(prim *)ppVar15->second,(Prim *)(ulong)(local_1c + 3),uVar17
                        );
              ::std::operator<<(aoStack_198,(string *)&i_2);
              ::std::__cxx11::string::~string((string *)&i_2);
              pvVar8 = Variant::primChildren(local_2e8);
              sVar9 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                                ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
              if (nameTok.str_.field_2._8_8_ != sVar9 - 1) {
                ::std::operator<<(aoStack_198,"\n");
              }
            }
            Token::~Token((Token *)&it);
            nameTok.str_.field_2._8_8_ = nameTok.str_.field_2._8_8_ + 1;
          }
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  *)&i);
          uVar17 = extraout_EDX;
        }
        else {
LAB_004313c3:
          local_3f8 = 0;
          while( true ) {
            uVar3 = local_3f8;
            pvVar8 = Variant::primChildren(local_2e8);
            sVar9 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
            uVar17 = extraout_EDX_00;
            if (sVar9 <= uVar3) break;
            pvVar8 = Variant::primChildren(local_2e8);
            uVar17 = (uint32_t)sVar9;
            pvVar12 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                                (pvVar8,local_3f8);
            print_prim_abi_cxx11_(&local_418,(prim *)pvVar12,(Prim *)(ulong)(local_1c + 3),uVar17);
            ::std::operator<<(aoStack_198,(string *)&local_418);
            ::std::__cxx11::string::~string((string *)&local_418);
            uVar3 = local_3f8;
            pvVar8 = Variant::primChildren(local_2e8);
            sVar9 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
            if (uVar3 != sVar9 - 1) {
              ::std::operator<<(aoStack_198,"\n");
            }
            local_3f8 = local_3f8 + 1;
          }
        }
        pprint::Indent_abi_cxx11_(&local_438,(pprint *)(ulong)(local_1c + 2),uVar17);
        poVar16 = ::std::operator<<(aoStack_198,(string *)&local_438);
        ::std::operator<<(poVar16,"}\n");
        ::std::__cxx11::string::~string((string *)&local_438);
        ::std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>
        ::operator++(&__end4);
      }
      pprint::Indent_abi_cxx11_
                ((string *)&primNameTable_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (pprint *)(ulong)(local_1c + 1),n_00);
      poVar16 = ::std::operator<<(aoStack_198,
                                  (string *)
                                  &primNameTable_1._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      ::std::operator<<(poVar16,"}\n");
      ::std::__cxx11::string::~string
                ((string *)&primNameTable_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>
      ::operator++(&__end3);
    }
  }
  pvVar8 = Prim::children(pPStack_18);
  sVar9 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                    ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
  uVar17 = extraout_EDX_01;
  if (sVar9 != 0) {
    if (bVar2) {
      ::std::operator<<(aoStack_198,"\n");
    }
    pPVar10 = Prim::metas(pPStack_18);
    sVar9 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      (&pPVar10->primChildren);
    pvVar8 = Prim::children(pPStack_18);
    sVar11 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                       ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
    if (sVar9 == sVar11) {
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
             *)&i_3);
      local_490 = 0;
      while( true ) {
        uVar3 = local_490;
        pvVar8 = Prim::children(pPStack_18);
        sVar9 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                          ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
        if (sVar9 <= uVar3) break;
        pvVar8 = Prim::children(pPStack_18);
        pvVar12 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                            (pvVar8,local_490);
        psVar13 = Prim::element_name_abi_cxx11_(pvVar12);
        pvVar8 = Prim::children(pPStack_18);
        local_498 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                              (pvVar8,local_490);
        ::std::
        map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
        ::emplace<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                  ((map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                    *)&i_3,psVar13,&local_498);
        local_490 = local_490 + 1;
      }
      nameTok_1.str_.field_2._8_8_ = 0;
      while( true ) {
        pPVar10 = Prim::metas(pPStack_18);
        sVar9 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          (&pPVar10->primChildren);
        if (sVar9 <= (ulong)nameTok_1.str_.field_2._8_8_) break;
        if (nameTok_1.str_.field_2._8_8_ != 0) {
          ::std::operator<<(aoStack_198,"\n");
        }
        uVar17 = (uint32_t)sVar9;
        pPVar10 = Prim::metas(pPStack_18);
        pvVar14 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                            (&pPVar10->primChildren,nameTok_1.str_.field_2._8_8_);
        Token::Token((Token *)&it_1,pvVar14);
        psVar13 = Token::str_abi_cxx11_((Token *)&it_1);
        local_4d8._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                     *)&i_3,psVar13);
        local_4e0._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                    *)&i_3);
        bVar2 = ::std::operator!=(&local_4d8,&local_4e0);
        if (bVar2) {
          ppVar15 = ::std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>
                    ::operator->(&local_4d8);
          print_prim_abi_cxx11_
                    ((string *)&i_5,(prim *)ppVar15->second,(Prim *)(ulong)(local_1c + 1),uVar17);
          ::std::operator<<(aoStack_198,(string *)&i_5);
          ::std::__cxx11::string::~string((string *)&i_5);
        }
        Token::~Token((Token *)&it_1);
        nameTok_1.str_.field_2._8_8_ = nameTok_1.str_.field_2._8_8_ + 1;
      }
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              *)&i_3);
      uVar17 = extraout_EDX_02;
    }
    else {
      local_508 = 0;
      while( true ) {
        uVar3 = local_508;
        pvVar8 = Prim::children(pPStack_18);
        sVar9 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                          ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar8);
        uVar17 = extraout_EDX_03;
        if (sVar9 <= uVar3) break;
        if (local_508 != 0) {
          ::std::operator<<(aoStack_198,"\n");
        }
        uVar17 = (uint32_t)sVar9;
        pvVar8 = Prim::children(pPStack_18);
        pvVar12 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                            (pvVar8,local_508);
        print_prim_abi_cxx11_(&local_528,(prim *)pvVar12,(Prim *)(ulong)(local_1c + 1),uVar17);
        ::std::operator<<(aoStack_198,(string *)&local_528);
        ::std::__cxx11::string::~string((string *)&local_528);
        local_508 = local_508 + 1;
      }
    }
  }
  pprint::Indent_abi_cxx11_(&local_548,(pprint *)(ulong)local_1c,uVar17);
  poVar16 = ::std::operator<<(aoStack_198,(string *)&local_548);
  ::std::operator<<(poVar16,"}\n");
  ::std::__cxx11::string::~string((string *)&local_548);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::string::~string((string *)local_1c8);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(s.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string print_prim(const Prim &prim, const uint32_t indent) {
  std::stringstream ss;

  // Currently, Prim's elementName is read from name variable in concrete Prim
  // class(e.g. Xform::name).
  // TODO: use prim.elementPath for elementName.
  std::string s = pprint_value(prim.data(), indent, /* closing_brace */ false);

  bool require_newline = true;

  // Check last 2 chars.
  // if it ends with '{\n', no properties are authored so do not emit blank line
  // before printing VariantSet or child Prims.
  if (s.size() > 2) {
    if ((s[s.size() - 2] == '{') && (s[s.size() - 1] == '\n')) {
      require_newline = false;
    }
  }

  ss << s;

  //
  // print variant
  //
  if (prim.variantSets().size()) {
    if (require_newline) {
      ss << "\n";
    }

    // need to add blank line after VariantSet stmt and before child Prims,
    // so set require_newline true
    require_newline = true;

    for (const auto &variantSet : prim.variantSets()) {
      ss << pprint::Indent(indent + 1) << "variantSet "
         << quote(variantSet.first) << " = {\n";

      for (const auto &variantItem : variantSet.second.variantSet) {
        ss << pprint::Indent(indent + 2) << quote(variantItem.first);

        const Variant &variant = variantItem.second;

        if (variant.metas().authored()) {
          ss << " (\n";
          ss << print_prim_metas(variant.metas(), indent + 3);
          ss << pprint::Indent(indent + 2) << ")";
        }

        ss << " {\n";

        ss << print_props(variant.properties(), indent + 3);

        if (variant.metas().variantChildren.has_value() &&
            (variant.metas().variantChildren.value().size() ==
             variant.primChildren().size())) {
          std::map<std::string, const Prim *> primNameTable;
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            primNameTable.emplace(variant.primChildren()[i].element_name(),
                                  &variant.primChildren()[i]);
          }

          for (size_t i = 0; i < variant.metas().variantChildren.value().size();
               i++) {
            value::token nameTok = variant.metas().variantChildren.value()[i];
            const auto it = primNameTable.find(nameTok.str());
            if (it != primNameTable.end()) {
              ss << print_prim(*(it->second), indent + 3);
              if (i != (variant.primChildren().size() - 1)) {
                ss << "\n";
              }
            } else {
              // TODO: Report warning?
            }
          }

        } else {
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            ss << print_prim(variant.primChildren()[i], indent + 3);
            if (i != (variant.primChildren().size() - 1)) {
              ss << "\n";
            }
          }
        }

        ss << pprint::Indent(indent + 2) << "}\n";
      }

      ss << pprint::Indent(indent + 1) << "}\n";
    }
  }

  //
  // primChildren
  //
  if (prim.children().size()) {
    if (require_newline) {
      ss << "\n";
      require_newline = false;
    }
    if (prim.metas().primChildren.size() == prim.children().size()) {
      // Use primChildren info to determine the order of the traversal.

      std::map<std::string, const Prim *> primNameTable;
      for (size_t i = 0; i < prim.children().size(); i++) {
        primNameTable.emplace(prim.children()[i].element_name(),
                              &prim.children()[i]);
      }

      for (size_t i = 0; i < prim.metas().primChildren.size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        value::token nameTok = prim.metas().primChildren[i];
        DCOUT(fmt::format("primChildren  {}/{} = {}", i,
                          prim.metas().primChildren.size(), nameTok.str()));
        const auto it = primNameTable.find(nameTok.str());
        if (it != primNameTable.end()) {
          ss << print_prim(*(it->second), indent + 1);
        } else {
          // TODO: Report warning?
        }
      }

    } else {
      for (size_t i = 0; i < prim.children().size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        ss << print_prim(prim.children()[i], indent + 1);
      }
    }
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}